

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3FileData.h
# Opt level: O2

void Assimp::MD3::LatLngNormalToVec3(uint16_t p_iNormal,ai_real *p_afOut)

{
  undefined2 in_register_0000003a;
  float fVar1;
  float fVar2;
  float fVar3;
  float __x;
  
  fVar1 = (float)(CONCAT22(in_register_0000003a,p_iNormal) >> 8) * 0.024546297;
  __x = (float)(p_iNormal & 0xff) * 0.024546297;
  fVar2 = cosf(fVar1);
  fVar3 = sinf(__x);
  *p_afOut = fVar3 * fVar2;
  fVar1 = sinf(fVar1);
  fVar2 = sinf(__x);
  p_afOut[1] = fVar2 * fVar1;
  fVar1 = cosf(__x);
  p_afOut[2] = fVar1;
  return;
}

Assistant:

inline void LatLngNormalToVec3(uint16_t p_iNormal, ai_real* p_afOut)
{
    ai_real lat = (ai_real)(( p_iNormal >> 8u ) & 0xff);
    ai_real lng = (ai_real)(( p_iNormal & 0xff ));
    const ai_real invVal( ai_real( 1.0 ) / ai_real( 128.0 ) );
    lat *= ai_real( 3.141926 ) * invVal;
    lng *= ai_real( 3.141926 ) * invVal;

    p_afOut[ 0 ] = std::cos(lat) * std::sin(lng);
    p_afOut[ 1 ] = std::sin(lat) * std::sin(lng);
    p_afOut[ 2 ] = std::cos(lng);
}